

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
populate_initial_block_list
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          size_t blockCount)

{
  Block *pBVar1;
  ulong local_20;
  size_t i;
  size_t blockCount_local;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this_local;
  
  this->initialBlockPoolSize = blockCount;
  if (this->initialBlockPoolSize == 0) {
    this->initialBlockPool = (Block *)0x0;
  }
  else {
    pBVar1 = ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
             create_array<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                       (blockCount);
    this->initialBlockPool = pBVar1;
    if (this->initialBlockPool == (Block *)0x0) {
      this->initialBlockPoolSize = 0;
    }
    for (local_20 = 0; local_20 < this->initialBlockPoolSize; local_20 = local_20 + 1) {
      this->initialBlockPool[local_20].dynamicallyAllocated = false;
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount)
	{
		initialBlockPoolSize = blockCount;
		if (initialBlockPoolSize == 0) {
			initialBlockPool = nullptr;
			return;
		}
		
		initialBlockPool = create_array<Block>(blockCount);
		if (initialBlockPool == nullptr) {
			initialBlockPoolSize = 0;
		}
		for (size_t i = 0; i < initialBlockPoolSize; ++i) {
			initialBlockPool[i].dynamicallyAllocated = false;
		}
	}